

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

void callTMres(lua_State *L,StkId res,TValue *f,TValue *p1,TValue *p2)

{
  StkId pTVar1;
  StkId pTVar2;
  long lVar3;
  
  pTVar1 = L->top;
  pTVar2 = L->stack;
  pTVar1->value = f->value;
  pTVar1->tt = f->tt;
  pTVar1 = L->top;
  pTVar1[1].value = p1->value;
  pTVar1[1].tt = p1->tt;
  pTVar1 = L->top;
  pTVar1[2].value = p2->value;
  pTVar1[2].tt = p2->tt;
  if ((long)L->stack_last - (long)L->top < 0x31) {
    luaD_growstack(L,3);
  }
  lVar3 = (long)res - (long)pTVar2;
  pTVar1 = L->top;
  L->top = pTVar1 + 3;
  luaD_call(L,pTVar1,1);
  pTVar1 = L->top;
  pTVar2 = L->stack;
  L->top = pTVar1 + -1;
  *(Value *)((long)pTVar2 + lVar3) = pTVar1[-1].value;
  *(int *)((long)pTVar2 + lVar3 + 8) = pTVar1[-1].tt;
  return;
}

Assistant:

static void callTMres(lua_State*L,StkId res,const TValue*f,
const TValue*p1,const TValue*p2){
ptrdiff_t result=savestack(L,res);
setobj(L,L->top,f);
setobj(L,L->top+1,p1);
setobj(L,L->top+2,p2);
luaD_checkstack(L,3);
L->top+=3;
luaD_call(L,L->top-3,1);
res=restorestack(L,result);
L->top--;
setobj(L,res,L->top);
}